

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

bool __thiscall MakefileGenerator::canExecute(MakefileGenerator *this,QStringList *cmdline,int *a)

{
  QString file;
  bool bVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int i;
  ulong uVar5;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff78;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = 0;
  iVar4 = -1;
  for (uVar5 = 0; uVar5 < (ulong)(cmdline->d).size; uVar5 = uVar5 + 1) {
    bVar1 = QString::contains((QString *)((long)&(((cmdline->d).ptr)->d).d + lVar3),(QChar)0x3d,
                              CaseSensitive);
    if (!bVar1) {
      iVar4 = (int)uVar5;
      break;
    }
    lVar3 = lVar3 + 0x18;
  }
  if (a != (int *)0x0) {
    *a = iVar4;
  }
  if (iVar4 != -1) {
    local_58.size = -0x5555555555555556;
    local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    Option::normalizePath((QString *)&local_58,(cmdline->d).ptr + iVar4,true,true);
    local_70.d = local_58.d;
    local_70.ptr = local_58.ptr;
    local_70.size = local_58.size;
    if (local_58.d != (Data *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    file.d.ptr = (char16_t *)this;
    file.d.d = (Data *)in_stack_ffffffffffffff78;
    file.d.size = (qsizetype)a;
    bVar1 = exists(this,file);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    bVar2 = true;
    if (bVar1) goto LAB_0013cd0b;
  }
  bVar2 = false;
LAB_0013cd0b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool MakefileGenerator::canExecute(const QStringList &cmdline, int *a) const
{
    int argv0 = -1;
    for(int i = 0; i < cmdline.size(); ++i) {
        if(!cmdline.at(i).contains('=')) {
            argv0 = i;
            break;
        }
    }
    if(a)
        *a = argv0;
    if(argv0 != -1) {
        const QString c = Option::normalizePath(cmdline.at(argv0));
        if(exists(c))
            return true;
    }
    return false;
}